

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void http_sc_reap(void *arg)

{
  void *item;
  int iVar1;
  
  item = *(void **)((long)arg + 0x18);
  if (*(char *)((long)arg + 0x31) == '\x01') {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server.c"
              ,0xeb,"!sc->finished");
  }
  *(undefined1 *)((long)arg + 0x31) = 1;
  nni_aio_stop((nni_aio *)((long)arg + 0x210));
  nni_aio_stop((nni_aio *)((long)arg + 0x3d8));
  nni_aio_stop((nni_aio *)((long)arg + 0x5a0));
  nni_aio_stop((nni_aio *)((long)arg + 0x48));
  if (*(nni_http_conn **)((long)arg + 0x10) != (nni_http_conn *)0x0) {
    nni_http_conn_fini(*(nni_http_conn **)((long)arg + 0x10));
  }
  nni_aio_fini((nni_aio *)((long)arg + 0x210));
  nni_aio_fini((nni_aio *)((long)arg + 0x3d8));
  nni_aio_fini((nni_aio *)((long)arg + 0x5a0));
  nni_aio_fini((nni_aio *)((long)arg + 0x48));
  nni_mtx_lock((nni_mtx *)((long)item + 0xd0));
  iVar1 = nni_list_node_active((nni_list_node *)arg);
  if (iVar1 != 0) {
    nni_list_remove((nni_list *)((long)item + 0xb8),arg);
  }
  iVar1 = nni_list_empty((nni_list *)((long)item + 0xb8));
  if ((iVar1 != 0) && (*(char *)((long)item + 0xf9) == '\x01')) {
    nni_reap(&http_server_reap_list,item);
  }
  nni_mtx_unlock((nni_mtx *)((long)item + 0xd0));
  nni_free(arg,0x7a0);
  return;
}

Assistant:

static void
http_sc_reap(void *arg)
{
	http_sconn      *sc = arg;
	nni_http_server *s  = sc->server;
	NNI_ASSERT(!sc->finished);
	sc->finished = true;
	nni_aio_stop(&sc->rxaio);
	nni_aio_stop(&sc->txaio);
	nni_aio_stop(&sc->txdataio);
	nni_aio_stop(&sc->cbaio);

	if (sc->conn != NULL) {
		nni_http_conn_fini(sc->conn);
	}
	nni_aio_fini(&sc->rxaio);
	nni_aio_fini(&sc->txaio);
	nni_aio_fini(&sc->txdataio);
	nni_aio_fini(&sc->cbaio);

	// Now it is safe to release our reference on the server.
	nni_mtx_lock(&s->mtx);
	if (nni_list_node_active(&sc->node)) {
		nni_list_remove(&s->conns, sc);
	}
	if (nni_list_empty(&s->conns) && (s->fini)) {
		nni_reap(&http_server_reap_list, s);
	}
	nni_mtx_unlock(&s->mtx);

	NNI_FREE_STRUCT(sc);
}